

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_wrapper_s(miniscript_node_t *node,miniscript_node_t *parent)

{
  int iVar1;
  
  iVar1 = -2;
  if ((~node->type_properties & 0x201) == 0) {
    node->type_properties = node->type_properties & 0x3f806 | 8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int verify_miniscript_wrapper_s(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    uint32_t need_type = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_O;
    (void)parent;

    if ((x_prop & need_type) != need_type)
        return WALLY_EINVAL;

    node->type_properties &= ~need_type;
    node->type_properties |= MINISCRIPT_TYPE_W;
    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_U |
                             MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_F |
                             MINISCRIPT_PROPERTY_E | MINISCRIPT_PROPERTY_M |
                             MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_X;

    return WALLY_OK;
}